

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O3

ChLoad<chrono::ChLoaderGravity> * __thiscall
chrono::ChLoad<chrono::ChLoaderGravity>::Clone(ChLoad<chrono::ChLoaderGravity> *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  double dVar3;
  ChLoad<chrono::ChLoaderGravity> *this_00;
  
  this_00 = (ChLoad<chrono::ChLoaderGravity> *)::operator_new(0x88);
  ChObj::ChObj((ChObj *)this_00,(ChObj *)this);
  (this_00->super_ChLoadBase).jacobians = (this->super_ChLoadBase).jacobians;
  (this_00->super_ChLoadBase).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLoad_00b33b20;
  (this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoader_00b2ae90;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)
             &(this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q,
             (DenseStorage<double,__1,__1,_1,_0> *)
             &(this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader.Q);
  (this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_00b2ae50;
  p_Var2 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var1 = (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
           super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
  super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
       super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.loadable.
  super___shared_ptr<chrono::ChLoadableUVW,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var2;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this_00->loader).super_ChLoaderUVWdistributed.super_ChLoaderUVW.super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVW_00b33bf0;
  dVar3 = (this->loader).G_acc.m_data[1];
  (this_00->loader).G_acc.m_data[0] = (this->loader).G_acc.m_data[0];
  (this_00->loader).G_acc.m_data[1] = dVar3;
  (this_00->loader).G_acc.m_data[2] = (this->loader).G_acc.m_data[2];
  (this_00->loader).num_int_points = (this->loader).num_int_points;
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }